

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O2

bool __thiscall soul::Structure::hasMemberWithName(Structure *this,string_view memberName)

{
  const_iterator cVar1;
  allocator<char> local_41;
  key_type local_40;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = memberName._M_str;
  local_20._M_len = memberName._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,&local_20,&local_41);
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->memberIndexMap)._M_h,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return cVar1.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool Structure::hasMemberWithName (std::string_view memberName) const
{
    return (memberIndexMap.find (std::string (memberName)) != memberIndexMap.end());
}